

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.h
# Opt level: O2

void __thiscall AST::FloatLit::FloatLit(FloatLit *this,string *value)

{
  double dVar1;
  
  (this->super_Expr).super_Stmt._vptr_Stmt = (_func_int **)&PTR__Stmt_0017fb48;
  dVar1 = std::__cxx11::stod(value,(size_t *)0x0);
  this->m_value = dVar1;
  return;
}

Assistant:

explicit FloatLit(const std::string &value) : m_value(std::stod(value)) { }